

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testQuatSlerp.cpp
# Opt level: O0

void anon_unknown.dwarf_9a7c4::compareQuats(Quatf *q1,Quatf *q2,float e)

{
  bool bVar1;
  float *in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  
  bVar1 = Imath_3_2::equalWithAbsError<float>(in_RDI[1],in_RSI[1],in_XMM0_Da);
  if (!bVar1) {
    __assert_fail("equalWithAbsError (q1.v.x, q2.v.x, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testQuatSlerp.cpp"
                  ,0x1a,
                  "void (anonymous namespace)::compareQuats(const Quatf &, const Quatf &, float)");
  }
  bVar1 = Imath_3_2::equalWithAbsError<float>(in_RDI[2],in_RSI[2],in_XMM0_Da);
  if (!bVar1) {
    __assert_fail("equalWithAbsError (q1.v.y, q2.v.y, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testQuatSlerp.cpp"
                  ,0x1b,
                  "void (anonymous namespace)::compareQuats(const Quatf &, const Quatf &, float)");
  }
  bVar1 = Imath_3_2::equalWithAbsError<float>(in_RDI[3],in_RSI[3],in_XMM0_Da);
  if (!bVar1) {
    __assert_fail("equalWithAbsError (q1.v.z, q2.v.z, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testQuatSlerp.cpp"
                  ,0x1c,
                  "void (anonymous namespace)::compareQuats(const Quatf &, const Quatf &, float)");
  }
  bVar1 = Imath_3_2::equalWithAbsError<float>(*in_RDI,*in_RSI,in_XMM0_Da);
  if (!bVar1) {
    __assert_fail("equalWithAbsError (q1.r, q2.r, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testQuatSlerp.cpp"
                  ,0x1d,
                  "void (anonymous namespace)::compareQuats(const Quatf &, const Quatf &, float)");
  }
  return;
}

Assistant:

void
compareQuats (const Quatf& q1, const Quatf& q2, float e)
{
    assert (equalWithAbsError (q1.v.x, q2.v.x, e));
    assert (equalWithAbsError (q1.v.y, q2.v.y, e));
    assert (equalWithAbsError (q1.v.z, q2.v.z, e));
    assert (equalWithAbsError (q1.r, q2.r, e));
}